

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

Gia_Man_t * Bmc_CexBuildNetwork(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Man_t *pGVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  Gia_Obj_t *pGVar15;
  int v;
  int iVar16;
  
  iVar16 = pCex->nRegs;
  p_00 = Gia_ManStart(1000);
  pcVar3 = Abc_UtilStrsav("unate");
  p_00->pName = pcVar3;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  p->pObjs->Value = 0xffffffff;
  for (iVar11 = 0; iVar11 < p->nRegs; iVar11 = iVar11 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar11);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x4000000000000000;
    pGVar4->Value = 0xffffffff;
  }
  Gia_ManHashAlloc(p_00);
  iVar11 = 0;
  do {
    if (pCex->iFrame < iVar11) {
      Gia_ManHashStop(p_00);
      if (iVar16 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x10e,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      pGVar4 = Gia_ManPo(p,pCex->iPo);
      if (((uint)*(ulong *)pGVar4 >> 0x1e & 1) == 0) {
        __assert_fail("pObj->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x111,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      if ((*(ulong *)pGVar4 & 0x4000000000000000) != 0) {
        __assert_fail("pObj->fMark1 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                      ,0x112,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
      }
      if (pGVar4->Value != 0) {
        Gia_ManAppendCo(p_00,pGVar4->Value);
        pGVar7 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar7;
      }
      __assert_fail("pObj->Value > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                    ,0x113,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
    }
    for (v = 0; iVar12 = iVar16 + v, v < p->vCis->nSize - p->nRegs; v = v + 1) {
      pGVar4 = Gia_ManCi(p,v);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xbfffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[iVar12 >> 5] >> ((byte)iVar12 & 0x1f) & 1) << 0x1e);
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar4->Value = uVar1;
    }
    for (iVar16 = 0; iVar16 < p->nRegs; iVar16 = iVar16 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar16);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)pGVar4;
      uVar6 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar6 & 0xffffffffbfffffff | uVar14 & 0x40000000;
      *(ulong *)pGVar5 =
           uVar6 & 0xbfffffffbfffffff | uVar14 & 0x40000000 | *(ulong *)pGVar4 & 0x4000000000000000;
      pGVar5->Value = pGVar4->Value;
    }
    for (iVar16 = 0; iVar16 < p->nObjs; iVar16 = iVar16 + 1) {
      pGVar4 = Gia_ManObj(p,iVar16);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)pGVar4;
      uVar6 = uVar14 & 0x1fffffff;
      if (uVar6 != 0x1fffffff && -1 < (int)uVar14) {
        pGVar5 = pGVar4 + -uVar6;
        uVar2 = *(uint *)(pGVar4 + -uVar6) >> 0x1e & 1;
        uVar1 = (uint)(uVar14 >> 0x1d);
        uVar8 = uVar1 & 1;
        uVar13 = (uint)(uVar14 >> 0x20);
        uVar10 = (ulong)(uVar13 & 0x1fffffff);
        pGVar15 = pGVar4 + -uVar10;
        uVar9 = *(uint *)(pGVar4 + -uVar10) >> 0x1e & 1;
        uVar13 = uVar13 >> 0x1d & 1;
        uVar1 = (uVar9 ^ uVar13) & (*(uint *)(pGVar4 + -uVar6) >> 0x1e ^ uVar1 & 7);
        uVar6 = (ulong)(uVar1 << 0x1e);
        *(ulong *)pGVar4 = uVar14 & 0xffffffff3fffffff | uVar6;
        if (uVar1 == 0) {
          if ((uVar2 == uVar8) && (uVar9 == uVar13)) {
            uVar6 = *(ulong *)pGVar15 | *(ulong *)pGVar5;
          }
          else if (uVar2 == uVar8) {
            uVar6 = *(ulong *)pGVar5;
          }
          else {
            if (uVar9 != uVar13) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                            ,0xf6,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
            }
            uVar6 = *(ulong *)pGVar15;
          }
          uVar14 = uVar14 & 0xbfffffff3fffffff | uVar6 & 0x4000000000000000;
        }
        else {
          uVar14 = uVar14 & 0xbfffffff3fffffff | uVar6 |
                   *(ulong *)pGVar5 & 0x4000000000000000 & *(ulong *)pGVar15;
        }
        *(ulong *)pGVar4 = uVar14;
        pGVar4->Value = 0xffffffff;
        if ((uVar14 & 0x4000000000000000) == 0) {
          if ((uint)uVar14 >> 0x1e == 0) {
            if ((uVar2 == uVar8) && (uVar9 == uVar13)) {
              uVar1 = Gia_ManHashOr(p_00,pGVar4[-(uVar14 & 0x1fffffff)].Value,
                                    pGVar4[-(uVar14 >> 0x20 & 0x1fffffff)].Value);
            }
            else {
              if (uVar2 != uVar8) {
                if (uVar9 != uVar13) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                                ,0x102,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
                }
                uVar14 = uVar14 >> 0x20;
              }
              uVar1 = pGVar4[-(ulong)((uint)uVar14 & 0x1fffffff)].Value;
            }
          }
          else {
            uVar1 = Gia_ManHashAnd(p_00,pGVar4[-(uVar14 & 0x1fffffff)].Value,
                                   pGVar4[-(uVar14 >> 0x20 & 0x1fffffff)].Value);
          }
          pGVar4->Value = uVar1;
          if (uVar1 == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                          ,0x103,"Gia_Man_t *Bmc_CexBuildNetwork(Gia_Man_t *, Abc_Cex_t *)");
          }
        }
      }
    }
    for (iVar16 = 0; iVar16 < p->vCos->nSize; iVar16 = iVar16 + 1) {
      pGVar4 = Gia_ManCo(p,iVar16);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)pGVar4;
      uVar6 = (ulong)((uint)uVar14 & 0x1fffffff);
      uVar10 = (ulong)(((uint)uVar14 * 2 ^ *(uint *)(pGVar4 + -uVar6)) & 0x40000000);
      *(ulong *)pGVar4 = uVar14 & 0xffffffffbfffffff | uVar10;
      *(ulong *)pGVar4 =
           uVar14 & 0xbfffffffbfffffff | uVar10 | *(ulong *)(pGVar4 + -uVar6) & 0x4000000000000000;
      pGVar4->Value = pGVar4[-uVar6].Value;
    }
    iVar11 = iVar11 + 1;
    iVar16 = iVar12;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = pCex->nRegs;
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = 0;
        pObj->fMark1 = 1;
        pObj->Value  = ~0;
    }
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 0;
            pObj->Value  = Gia_ManAppendCi(pNew);
        }
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}